

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

ptls_t * ptls_client_new(ptls_context_t *ctx)

{
  ptls_t *tls;
  uint8_t *puVar1;
  
  tls = new_instance(ctx,0);
  tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
  (*tls->ctx->random_bytes)(tls->client_random,0x20);
  log_client_random(tls);
  if ((tls->field_0x1e8 & 4) != 0) {
    puVar1 = (uint8_t *)((long)&tls->field_19 + 0x10);
    (tls->field_19).client.legacy_session_id.base = puVar1;
    (tls->field_19).client.legacy_session_id.len = 0x20;
    (*tls->ctx->random_bytes)(puVar1,0x20);
  }
  if (ptls_client_new::logpoint.state.generation != ptls_log._generation) {
    ptls_client_new_cold_1();
  }
  if (ptls_client_new::logpoint.state.active_conns != 0) {
    ptls_client_new_cold_2();
  }
  return tls;
}

Assistant:

ptls_t *ptls_client_new(ptls_context_t *ctx)
{
    ptls_t *tls = new_instance(ctx, 0);
    tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
    tls->ctx->random_bytes(tls->client_random, sizeof(tls->client_random));
    log_client_random(tls);
    if (tls->send_change_cipher_spec) {
        tls->client.legacy_session_id =
            ptls_iovec_init(tls->client.legacy_session_id_buf, sizeof(tls->client.legacy_session_id_buf));
        tls->ctx->random_bytes(tls->client.legacy_session_id.base, tls->client.legacy_session_id.len);
    }

    PTLS_PROBE(NEW, tls, 0);
    PTLS_LOG_CONN(new, tls, { PTLS_LOG_ELEMENT_BOOL(is_server, 0); });
    return tls;
}